

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_table_t::wasm_table_t(wasm_table_t *this,RefPtr<wabt::interp::Table> *ptr)

{
  RefPtr<wabt::interp::Extern> RStack_28;
  
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr<wabt::interp::Table>(&RStack_28,ptr);
  wasm_extern_t::wasm_extern_t(&this->super_wasm_extern_t,&RStack_28);
  wabt::interp::RefPtr<wabt::interp::Extern>::reset(&RStack_28);
  return;
}

Assistant:

wasm_table_t(RefPtr<Table> ptr) : wasm_extern_t(ptr) {}